

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_minbroadcastable
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x366) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x366;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.minbroadcastable_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::MinBroadcastableLayerParams>(arena);
    (this->layer_).minbroadcastable_ = (MinBroadcastableLayerParams *)LVar2;
  }
  return (MinBroadcastableLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_minbroadcastable() {
  if (!_internal_has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MinBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.minbroadcastable_;
}